

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtQuantizedBvh.cpp
# Opt level: O1

void __thiscall cbtQuantizedBvh::buildInternal(cbtQuantizedBvh *this)

{
  int *piVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  int iVar4;
  cbtQuantizedBvhNode *ptr;
  cbtBvhSubtreeInfo *ptr_00;
  cbtOptimizedBvhNode *ptr_01;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int iVar8;
  cbtQuantizedBvhNode *pcVar9;
  long lVar10;
  cbtBvhSubtreeInfo *pcVar11;
  long lVar12;
  int iVar13;
  
  this->m_useQuantization = true;
  iVar8 = (this->m_quantizedLeafNodes).m_size;
  iVar13 = iVar8 * 2;
  iVar4 = (this->m_quantizedContiguousNodes).m_size;
  if ((iVar4 <= iVar13) && (iVar4 < iVar13)) {
    if ((this->m_quantizedContiguousNodes).m_capacity < iVar13) {
      if (iVar8 == 0) {
        pcVar9 = (cbtQuantizedBvhNode *)0x0;
      }
      else {
        pcVar9 = (cbtQuantizedBvhNode *)cbtAlignedAllocInternal((long)iVar8 << 5,0x10);
      }
      lVar10 = (long)(this->m_quantizedContiguousNodes).m_size;
      if (0 < lVar10) {
        lVar12 = 0;
        do {
          puVar2 = (undefined8 *)
                   ((long)((this->m_quantizedContiguousNodes).m_data)->m_quantizedAabbMin + lVar12);
          uVar5 = puVar2[1];
          puVar3 = (undefined8 *)((long)pcVar9->m_quantizedAabbMin + lVar12);
          *puVar3 = *puVar2;
          puVar3[1] = uVar5;
          lVar12 = lVar12 + 0x10;
        } while (lVar10 * 0x10 != lVar12);
      }
      ptr = (this->m_quantizedContiguousNodes).m_data;
      if (ptr != (cbtQuantizedBvhNode *)0x0) {
        if ((this->m_quantizedContiguousNodes).m_ownsMemory == true) {
          cbtAlignedFreeInternal(ptr);
        }
        (this->m_quantizedContiguousNodes).m_data = (cbtQuantizedBvhNode *)0x0;
      }
      (this->m_quantizedContiguousNodes).m_ownsMemory = true;
      (this->m_quantizedContiguousNodes).m_data = pcVar9;
      (this->m_quantizedContiguousNodes).m_capacity = iVar13;
    }
    if (iVar4 < iVar13) {
      lVar10 = (long)iVar13 - (long)iVar4;
      lVar12 = (long)iVar4 << 4;
      do {
        puVar2 = (undefined8 *)
                 ((long)((this->m_quantizedContiguousNodes).m_data)->m_quantizedAabbMin + lVar12);
        *puVar2 = 0;
        puVar2[1] = 0;
        lVar12 = lVar12 + 0x10;
        lVar10 = lVar10 + -1;
      } while (lVar10 != 0);
    }
  }
  (this->m_quantizedContiguousNodes).m_size = iVar13;
  this->m_curNodeIndex = 0;
  buildTree(this,0,iVar8);
  if (this->m_useQuantization == true) {
    if ((this->m_SubtreeHeaders).m_size == 0) {
      if ((this->m_SubtreeHeaders).m_capacity == 0) {
        pcVar11 = (cbtBvhSubtreeInfo *)cbtAlignedAllocInternal(0x20,0x10);
        lVar10 = (long)(this->m_SubtreeHeaders).m_size;
        if (0 < lVar10) {
          lVar12 = 0;
          do {
            puVar2 = (undefined8 *)
                     ((long)((this->m_SubtreeHeaders).m_data)->m_quantizedAabbMin + lVar12);
            uVar5 = puVar2[1];
            uVar6 = puVar2[2];
            uVar7 = puVar2[3];
            puVar3 = (undefined8 *)((long)pcVar11->m_quantizedAabbMin + lVar12);
            *puVar3 = *puVar2;
            puVar3[1] = uVar5;
            puVar3[2] = uVar6;
            puVar3[3] = uVar7;
            lVar12 = lVar12 + 0x20;
          } while (lVar10 * 0x20 != lVar12);
        }
        ptr_00 = (this->m_SubtreeHeaders).m_data;
        if (ptr_00 != (cbtBvhSubtreeInfo *)0x0) {
          if ((this->m_SubtreeHeaders).m_ownsMemory == true) {
            cbtAlignedFreeInternal(ptr_00);
          }
          (this->m_SubtreeHeaders).m_data = (cbtBvhSubtreeInfo *)0x0;
        }
        (this->m_SubtreeHeaders).m_ownsMemory = true;
        (this->m_SubtreeHeaders).m_data = pcVar11;
        (this->m_SubtreeHeaders).m_capacity = 1;
      }
      piVar1 = &(this->m_SubtreeHeaders).m_size;
      *piVar1 = *piVar1 + 1;
      pcVar9 = (this->m_quantizedContiguousNodes).m_data;
      pcVar11 = (this->m_SubtreeHeaders).m_data;
      pcVar11->m_quantizedAabbMin[0] = pcVar9->m_quantizedAabbMin[0];
      pcVar11->m_quantizedAabbMin[1] = pcVar9->m_quantizedAabbMin[1];
      pcVar11->m_quantizedAabbMin[2] = pcVar9->m_quantizedAabbMin[2];
      pcVar11->m_quantizedAabbMax[0] = pcVar9->m_quantizedAabbMax[0];
      pcVar11->m_quantizedAabbMax[1] = pcVar9->m_quantizedAabbMax[1];
      pcVar11->m_quantizedAabbMax[2] = pcVar9->m_quantizedAabbMax[2];
      pcVar11->m_rootNodeIndex = 0;
      iVar8 = 1;
      if (pcVar9->m_escapeIndexOrTriangleIndex < 0) {
        iVar8 = -pcVar9->m_escapeIndexOrTriangleIndex;
      }
      pcVar11->m_subtreeSize = iVar8;
    }
  }
  this->m_subtreeHeaderCount = (this->m_SubtreeHeaders).m_size;
  pcVar9 = (this->m_quantizedLeafNodes).m_data;
  if (pcVar9 != (cbtQuantizedBvhNode *)0x0) {
    if ((this->m_quantizedLeafNodes).m_ownsMemory == true) {
      cbtAlignedFreeInternal(pcVar9);
    }
    (this->m_quantizedLeafNodes).m_data = (cbtQuantizedBvhNode *)0x0;
  }
  (this->m_quantizedLeafNodes).m_ownsMemory = true;
  (this->m_quantizedLeafNodes).m_data = (cbtQuantizedBvhNode *)0x0;
  (this->m_quantizedLeafNodes).m_size = 0;
  (this->m_quantizedLeafNodes).m_capacity = 0;
  ptr_01 = (this->m_leafNodes).m_data;
  if (ptr_01 != (cbtOptimizedBvhNode *)0x0) {
    if ((this->m_leafNodes).m_ownsMemory == true) {
      cbtAlignedFreeInternal(ptr_01);
    }
    (this->m_leafNodes).m_data = (cbtOptimizedBvhNode *)0x0;
  }
  (this->m_leafNodes).m_ownsMemory = true;
  (this->m_leafNodes).m_data = (cbtOptimizedBvhNode *)0x0;
  (this->m_leafNodes).m_size = 0;
  (this->m_leafNodes).m_capacity = 0;
  return;
}

Assistant:

void cbtQuantizedBvh::buildInternal()
{
	///assumes that caller filled in the m_quantizedLeafNodes
	m_useQuantization = true;
	int numLeafNodes = 0;

	if (m_useQuantization)
	{
		//now we have an array of leafnodes in m_leafNodes
		numLeafNodes = m_quantizedLeafNodes.size();

		m_quantizedContiguousNodes.resize(2 * numLeafNodes);
	}

	m_curNodeIndex = 0;

	buildTree(0, numLeafNodes);

	///if the entire tree is small then subtree size, we need to create a header info for the tree
	if (m_useQuantization && !m_SubtreeHeaders.size())
	{
		cbtBvhSubtreeInfo& subtree = m_SubtreeHeaders.expand();
		subtree.setAabbFromQuantizeNode(m_quantizedContiguousNodes[0]);
		subtree.m_rootNodeIndex = 0;
		subtree.m_subtreeSize = m_quantizedContiguousNodes[0].isLeafNode() ? 1 : m_quantizedContiguousNodes[0].getEscapeIndex();
	}

	//PCK: update the copy of the size
	m_subtreeHeaderCount = m_SubtreeHeaders.size();

	//PCK: clear m_quantizedLeafNodes and m_leafNodes, they are temporary
	m_quantizedLeafNodes.clear();
	m_leafNodes.clear();
}